

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

void nni_posix_pfd_close(nni_posix_pfd *pfd)

{
  _Bool _Var1;
  undefined1 local_24 [8];
  epoll_event ev;
  nni_posix_pollq *pq;
  nni_posix_pfd *pfd_local;
  
  ev.data = (epoll_data_t)pfd->pq;
  if (((nni_posix_pollq *)ev.data.ptr != (nni_posix_pollq *)0x0) &&
     (_Var1 = nni_atomic_flag_test_and_set(&pfd->closing), !_Var1)) {
    shutdown(pfd->fd,2);
    epoll_ctl(*(int *)(ev.data.u64 + 0x60),2,pfd->fd,(epoll_event *)local_24);
  }
  return;
}

Assistant:

void
nni_posix_pfd_close(nni_posix_pfd *pfd)
{
	nni_posix_pollq *pq = pfd->pq;
	if (pq == NULL) {
		return;
	}
	if (nni_atomic_flag_test_and_set(&pfd->closing)) {
		return;
	}

	struct epoll_event ev; // Not actually used.

	(void) shutdown(pfd->fd, SHUT_RDWR);
	(void) epoll_ctl(pq->epfd, EPOLL_CTL_DEL, pfd->fd, &ev);
}